

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O0

void __thiscall lts2::LBDOperator::LBDOperator(LBDOperator *this,int M)

{
  BasisFunction *pBVar1;
  int M_local;
  LBDOperator *this_local;
  
  LinearOperator::LinearOperator(&this->super_LinearOperator);
  (this->super_LinearOperator)._vptr_LinearOperator = (_func_int **)&PTR__LBDOperator_00128790;
  *(int *)&(this->super_LinearOperator).field_0xc = M;
  cv::Size_<int>::Size_(&this->_patchSize,0x40,0x40);
  cv::Mat::Mat(&this->_integralImage);
  this->_basisFunctions = (BasisFunction *)0x0;
  this->_sensitiveCells = (IntegratingCell *)0x0;
  LinearOperator::setNorm(&this->super_LinearOperator,10.0);
  pBVar1 = (BasisFunction *)
           operator_new__((ulong)*(uint *)&(this->super_LinearOperator).field_0xc << 3);
  this->_basisFunctions = pBVar1;
  return;
}

Assistant:

lts2::LBDOperator::LBDOperator(int M) : lts2::LinearOperator(), _pairsInUse(M), _patchSize(cv::Size(64,64)), _sensitiveCells(NULL), _basisFunctions(NULL)
{
  this->setNorm(10.0);
  _basisFunctions = new lbd::BasisFunction[_pairsInUse];
}